

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<duckdb::uhugeint_t,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,uhugeint_t input)

{
  InternalException *this_00;
  Vector *in_RSI;
  long in_RDI;
  hugeint_t *result;
  CastParameters parameters;
  uint8_t scale;
  uint8_t width;
  LogicalType *type;
  string *in_stack_ffffffffffffff18;
  CastParameters *in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffff46;
  uint8_t in_stack_ffffffffffffff47;
  Vector *in_stack_ffffffffffffff48;
  BaseAppender *in_stack_ffffffffffffff50;
  uhugeint_t in_stack_ffffffffffffff58;
  
  if (*(char *)(in_RDI + 0x90) == '\0') {
    Vector::GetType(in_RSI);
    DecimalType::GetWidth((LogicalType *)in_stack_ffffffffffffff20);
    DecimalType::GetScale((LogicalType *)in_stack_ffffffffffffff20);
    CastParameters::CastParameters(in_stack_ffffffffffffff20);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x9414fc);
    DataChunk::size((DataChunk *)(in_RDI + 0x48));
    TryCastToDecimal::Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff58,(hugeint_t *)in_stack_ffffffffffffff50,
               (CastParameters *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,
               in_stack_ffffffffffffff46);
  }
  else {
    if (*(char *)(in_RDI + 0x90) != '\x01') {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff58,"Type not implemented for AppenderType",
                 (allocator *)&stack0xffffffffffffff57);
      InternalException::InternalException(this_00,in_stack_ffffffffffffff18);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    AppendValueInternal<duckdb::uhugeint_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}